

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O0

bool __thiscall
ASDCP::MXF::FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>::Archive
          (FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_> *this,MemIOWriter *Writer)

{
  const_iterator this_00;
  bool bVar1;
  ui32_t i_00;
  int iVar2;
  size_type sVar3;
  pointer pUVar4;
  byte local_59;
  _Self local_40;
  _Base_ptr local_38;
  byte local_29;
  iterator iStack_28;
  bool result;
  const_iterator i;
  MemIOWriter *Writer_local;
  FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_> *this_local;
  
  i._M_node = (_Base_ptr)Writer;
  sVar3 = std::set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>::size
                    (&(this->super_PushSet<ASDCP::UL>).
                      super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>);
  bVar1 = Kumu::MemIOWriter::WriteUi32BE(Writer,(ui32_t)sVar3);
  this_00 = i;
  if (bVar1) {
    i_00 = ItemSize(this);
    bVar1 = Kumu::MemIOWriter::WriteUi32BE((MemIOWriter *)this_00._M_node,i_00);
    if (bVar1) {
      bVar1 = std::set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>::empty
                        (&(this->super_PushSet<ASDCP::UL>).
                          super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        std::_Rb_tree_const_iterator<ASDCP::UL>::_Rb_tree_const_iterator(&stack0xffffffffffffffd8);
        local_29 = 1;
        local_38 = (_Base_ptr)
                   std::set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>::begin
                             (&(this->super_PushSet<ASDCP::UL>).
                               super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
                             );
        iStack_28 = (iterator)local_38;
        while( true ) {
          local_40._M_node =
               (_Base_ptr)
               std::set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>::end
                         (&(this->super_PushSet<ASDCP::UL>).
                           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>);
          bVar1 = std::operator!=(&stack0xffffffffffffffd8,&local_40);
          local_59 = 0;
          if (bVar1) {
            local_59 = local_29;
          }
          if ((local_59 & 1) == 0) break;
          pUVar4 = std::_Rb_tree_const_iterator<ASDCP::UL>::operator->(&stack0xffffffffffffffd8);
          iVar2 = (*(pUVar4->super_Identifier<16U>).super_IArchive._vptr_IArchive[4])
                            (pUVar4,i._M_node);
          local_29 = (byte)iVar2 & 1;
          std::_Rb_tree_const_iterator<ASDCP::UL>::operator++(&stack0xffffffffffffffd8);
        }
        this_local._7_1_ = (bool)(local_29 & 1);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Archive(Kumu::MemIOWriter* Writer) const {
	    if ( ! Writer->WriteUi32BE((ui32_t)this->size()) ) return false;
	    if ( ! Writer->WriteUi32BE((ui32_t)this->ItemSize()) ) return false;
	    if ( this->empty() ) return true;
	    
	    typename ContainerType::const_iterator i;
	    bool result = true;
	    for ( i = this->begin(); i != this->end() && result; ++i )
	      {
		result = i->Archive(Writer);
	      }

	    return result;
	  }